

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall
cmMakefile::GetExecutionFilePath_abi_cxx11_(string *__return_storage_ptr__,cmMakefile *this)

{
  bool bVar1;
  const_reference pvVar2;
  cmMakefile *this_local;
  
  bVar1 = std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::
          empty(&this->CallStack);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pvVar2 = std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::
             back(&this->CallStack);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&pvVar2->Context->FilePath);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetExecutionFilePath() const
{
  if (this->CallStack.empty())
    {
    return std::string();
    }
  return this->CallStack.back().Context->FilePath;
}